

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall
Fossilize::DatabaseInterface::DatabaseInterface(DatabaseInterface *this,DatabaseMode mode)

{
  Impl *this_00;
  
  this->_vptr_DatabaseInterface = (_func_int **)&PTR__DatabaseInterface_0017ca30;
  this_00 = (Impl *)operator_new(0x290);
  Impl::Impl(this_00);
  this->impl = this_00;
  this_00->mode = mode;
  return;
}

Assistant:

DatabaseInterface::DatabaseInterface(DatabaseMode mode)
{
	impl = new Impl;
	impl->mode = mode;
}